

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmListFileBacktrace __thiscall
TargetPropertyEntryGenex::GetBacktrace(TargetPropertyEntryGenex *this)

{
  long in_RSI;
  cmListFileBacktrace cVar1;
  TargetPropertyEntryGenex *this_local;
  
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              *)(in_RSI + 0x20));
  cVar1 = cmCompiledGeneratorExpression::GetBacktrace((cmCompiledGeneratorExpression *)this);
  cVar1.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (cmListFileBacktrace)
         cVar1.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmListFileBacktrace GetBacktrace() const override
  {
    return this->ge->GetBacktrace();
  }